

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_operators.hpp
# Opt level: O0

Scalar Disa::dot_product<double,0ul,3ul>
                 (Vector_Dense<double,_0UL> *vector_0,Vector_Dense<double,_3UL> *vector_1)

{
  source_location *psVar1;
  source_location *location;
  ostream *poVar2;
  size_type sVar3;
  const_iterator __first1;
  const_iterator __last1;
  const_iterator __first2;
  double dVar4;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined **local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  array<double,_3UL> *local_18;
  Vector_Dense<double,_3UL> *vector_1_local;
  Vector_Dense<double,_0UL> *vector_0_local;
  
  local_18 = &vector_1->super_array<double,_3UL>;
  vector_1_local = (Vector_Dense<double,_3UL> *)vector_0;
  psVar1 = (source_location *)
           std::vector<double,_std::allocator<double>_>::size
                     (&vector_0->super_vector<double,_std::allocator<double>_>);
  location = (source_location *)std::array<double,_3UL>::size(local_18);
  if (psVar1 != location) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    local_40 = &PTR_s__workspace_llm4binary_github_lic_001ee140;
    console_format_abi_cxx11_(&local_38,(Disa *)0x0,(Log_Level)&local_40,location);
    poVar2 = std::operator<<(poVar2,(string *)&local_38);
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)vector_1_local);
    std::__cxx11::to_string(&local_f0,sVar3);
    std::operator+(&local_d0,"Incompatible vector sizes, ",&local_f0);
    std::operator+(&local_b0,&local_d0," vs. ");
    sVar3 = std::array<double,_3UL>::size(local_18);
    std::__cxx11::to_string(&local_110,sVar3);
    std::operator+(&local_90,&local_b0,&local_110);
    std::operator+(&local_70,&local_90,".");
    poVar2 = std::operator<<(poVar2,(string *)&local_70);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_38);
    exit(1);
  }
  __first1 = std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)vector_1_local);
  __last1 = std::vector<double,_std::allocator<double>_>::end
                      ((vector<double,_std::allocator<double>_> *)vector_1_local);
  __first2 = std::array<double,_3UL>::begin(local_18);
  dVar4 = std::
          inner_product<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double_const*,double>
                    ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                      )__first1._M_current,
                     (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                      )__last1._M_current,__first2,0.0);
  return dVar4;
}

Assistant:

constexpr Scalar dot_product(const Vector_Dense<_type, _size_0>& vector_0,
                             const Vector_Dense<_type, _size_1>& vector_1) {
  ASSERT_DEBUG(vector_0.size() == vector_1.size(), "Incompatible vector sizes, " + std::to_string(vector_0.size()) +
                                                   " vs. " + std::to_string(vector_1.size()) + ".");
  return std::inner_product(vector_0.begin(), vector_0.end(), vector_1.begin(), 0.0);
}